

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O3

void radio_draw_new(t_radio *x,_glist *glist)

{
  _glist *in_RAX;
  _glist *p_Var1;
  uint uVar2;
  ulong uVar3;
  char *tags [4];
  char tag [128];
  char tag_n [128];
  char tag_object [128];
  
  p_Var1 = glist_getcanvas(in_RAX);
  tags[0] = tag_object;
  tags[1] = tag;
  tags[2] = tag_n;
  tags[3] = "text";
  sprintf(tags[0],"%lxOBJ",x);
  if (0 < x->x_number) {
    uVar3 = 0;
    do {
      sprintf(tag,"%lxBASE",x);
      sprintf(tag_n,"%lxBASE%d",x,uVar3);
      pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,0,0,"-tags",3,tags);
      sprintf(tag,"%lxBUT",x);
      sprintf(tag_n,"%lxBUT%d",x,uVar3);
      pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,0,0,"-tags",3,tags);
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while ((int)uVar2 < x->x_number);
  }
  sprintf(tag,"%lxBUT",x);
  sprintf(tag_n,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crss",p_Var1,"raise",tag,tag_n);
  sprintf(tag,"%lxLABEL",x);
  builtin_strncpy(tag_n,"label",6);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",4,tags);
  radio_draw_config(x,glist);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,6);
  return;
}

Assistant:

static void radio_draw_new(t_radio *x, t_glist *glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    int i;
    char tag_n[128], tag[128], tag_object[128];
    char *tags[] = {tag_object, tag, tag_n, "text"};
    sprintf(tag_object, "%lxOBJ", x);

    for(i=0; i<x->x_number; i++) {
        sprintf(tag, "%lxBASE", x);
        sprintf(tag_n, "%lxBASE%d", x, i);
        pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
            0, 0, 0, 0, "-tags", 3, tags);

        sprintf(tag, "%lxBUT", x);
        sprintf(tag_n, "%lxBUT%d", x, i);
        pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
            0, 0, 0, 0, "-tags", 3, tags);
    }
    /* make sure the buttons are above their base */
    sprintf(tag, "%lxBUT", x);
    sprintf(tag_n, "%lxBASE", x);
    pdgui_vmess(0, "crss", canvas, "raise", tag, tag_n);

    sprintf(tag, "%lxLABEL", x);
    sprintf(tag_n, "label");
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 4, tags);

    radio_draw_config(x, glist);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_IO);
}